

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_widget_is_hovered(nk_context *ctx)

{
  nk_rect rect;
  int iVar1;
  nk_input *in_RDI;
  nk_rect bounds;
  int ret;
  bool local_39;
  nk_context *in_stack_ffffffffffffffc8;
  nk_rect *in_stack_ffffffffffffffd0;
  undefined8 local_24;
  undefined8 uStack_1c;
  uint local_4;
  
  if ((in_RDI == (nk_input *)0x0) || (*(long *)&in_RDI[0x31].keyboard.keys[7].clicked == 0)) {
    local_4 = 0;
  }
  else {
    nk_layout_peek(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    local_39 = false;
    if (*(long *)&in_RDI[0x31].keyboard.keys[6].clicked ==
        *(long *)&in_RDI[0x31].keyboard.keys[7].clicked) {
      rect._8_8_ = uStack_1c;
      rect._0_8_ = local_24;
      iVar1 = nk_input_is_mouse_hovering_rect(in_RDI,rect);
      local_39 = iVar1 != 0;
    }
    local_4 = (uint)local_39;
  }
  return local_4;
}

Assistant:

NK_API int
nk_widget_is_hovered(struct nk_context *ctx)
{
    int ret;
    struct nk_rect bounds;
    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    if (!ctx || !ctx->current)
        return 0;

    nk_layout_peek(&bounds, ctx);
    ret = (ctx->active == ctx->current);
    ret = ret && nk_input_is_mouse_hovering_rect(&ctx->input, bounds);
    return ret;
}